

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControlPrivate::dragMoveEvent
          (QWidgetTextControlPrivate *this,QEvent *e,QMimeData *mimeData,QPointF *pos)

{
  QTextCursor *cursor;
  QWidgetTextControl *this_00;
  char cVar1;
  MoveMode MVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
    this_00 = *(QWidgetTextControl **)&this->field_0x8;
    cVar1 = (**(code **)(*(long *)this_00 + 0xa0))(this_00,mimeData);
    if (cVar1 != '\0') {
      MVar2 = (**(code **)(*(long *)this_00 + 0x78))(this_00,pos,1);
      bVar3 = true;
      if (MVar2 != ~MoveAnchor) {
        cursor = &this->dndFeedbackCursor;
        local_58.w = -NAN;
        local_58.h = -NAN;
        local_58.xp = -NAN;
        local_58.yp = -NAN;
        QWidgetTextControl::cursorRect(&local_58,this_00,cursor);
        if ((0.0 < local_58.w) && (0.0 < local_58.h)) {
          QWidgetTextControl::updateRequest(this_00,&local_58);
        }
        QTextCursor::operator=(cursor,&this->cursor);
        QTextCursor::setPosition((int)cursor,MVar2);
        QWidgetTextControl::cursorRect(&local_78,this_00,cursor);
        local_58.w = local_78.w;
        local_58.h = local_78.h;
        local_58.xp = local_78.xp;
        local_58.yp = local_78.yp;
        QWidgetTextControl::updateRequest(this_00,&local_58);
      }
      goto LAB_0047f929;
    }
  }
  e[0xc] = (QEvent)0x0;
  bVar3 = false;
LAB_0047f929:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::dragMoveEvent(QEvent *e, const QMimeData *mimeData, const QPointF &pos)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData)) {
        e->ignore();
        return false;
    }

    const int cursorPos = q->hitTest(pos, Qt::FuzzyHit);
    if (cursorPos != -1) {
        QRectF crect = q->cursorRect(dndFeedbackCursor);
        if (crect.isValid())
            emit q->updateRequest(crect);

        dndFeedbackCursor = cursor;
        dndFeedbackCursor.setPosition(cursorPos);

        crect = q->cursorRect(dndFeedbackCursor);
        emit q->updateRequest(crect);
    }

    return true; // accept proposed action
}